

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STArray.cpp
# Opt level: O1

void __thiscall jbcoin::STArray::STArray(STArray *this,STArray *other)

{
  atomic<int> *paVar1;
  SField *pSVar2;
  Counter *pCVar3;
  
  pSVar2 = (other->super_STBase).fName;
  (this->super_STBase)._vptr_STBase = (_func_int **)&PTR__STBase_002d6fc0;
  (this->super_STBase).fName = pSVar2;
  pCVar3 = CountedObject<jbcoin::STArray>::getCounter();
  LOCK();
  paVar1 = &(pCVar3->super_CounterBase).m_count;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  (this->super_STBase)._vptr_STBase = (_func_int **)&PTR__STArray_002d6ed8;
  (this->v_).super__Vector_base<jbcoin::STObject,_std::allocator<jbcoin::STObject>_>._M_impl.
  super__Vector_impl_data._M_start =
       (other->v_).super__Vector_base<jbcoin::STObject,_std::allocator<jbcoin::STObject>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->v_).super__Vector_base<jbcoin::STObject,_std::allocator<jbcoin::STObject>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (other->v_).super__Vector_base<jbcoin::STObject,_std::allocator<jbcoin::STObject>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->v_).super__Vector_base<jbcoin::STObject,_std::allocator<jbcoin::STObject>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (other->v_).super__Vector_base<jbcoin::STObject,_std::allocator<jbcoin::STObject>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (other->v_).super__Vector_base<jbcoin::STObject,_std::allocator<jbcoin::STObject>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (other->v_).super__Vector_base<jbcoin::STObject,_std::allocator<jbcoin::STObject>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (other->v_).super__Vector_base<jbcoin::STObject,_std::allocator<jbcoin::STObject>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

STArray::STArray (STArray&& other)
    : STBase(other.getFName())
    , v_(std::move(other.v_))
{
}